

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

uint64_t uv__read_proc_meminfo(char *what)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  size_t sVar5;
  uint64_t uVar6;
  uint64_t rc;
  char buf [4096];
  uint64_t local_1020;
  char local_1018 [4096];
  
  local_1020 = 0;
  iVar1 = uv__open_cloexec("/proc/meminfo",0);
  uVar6 = 0;
  if (iVar1 != -1) {
    sVar3 = read(iVar1,local_1018,0xfff);
    if (0 < sVar3) {
      local_1018[sVar3] = '\0';
      pcVar4 = strstr(local_1018,what);
      if (pcVar4 != (char *)0x0) {
        sVar5 = strlen(what);
        iVar2 = __isoc99_sscanf(pcVar4 + sVar5,"%lu kB",&local_1020);
        if (iVar2 == 1) {
          local_1020 = local_1020 << 10;
        }
      }
    }
    iVar1 = uv__close_nocheckstdio(iVar1);
    uVar6 = local_1020;
    if (iVar1 != 0) {
      abort();
    }
  }
  return uVar6;
}

Assistant:

static uint64_t uv__read_proc_meminfo(const char* what) {
  uint64_t rc;
  ssize_t n;
  char* p;
  int fd;
  char buf[4096];  /* Large enough to hold all of /proc/meminfo. */

  rc = 0;
  fd = uv__open_cloexec("/proc/meminfo", O_RDONLY);

  if (fd == -1)
    return 0;

  n = read(fd, buf, sizeof(buf) - 1);

  if (n <= 0)
    goto out;

  buf[n] = '\0';
  p = strstr(buf, what);

  if (p == NULL)
    goto out;

  p += strlen(what);

  if (1 != sscanf(p, "%" PRIu64 " kB", &rc))
    goto out;

  rc *= 1024;

out:

  if (uv__close_nocheckstdio(fd))
    abort();

  return rc;
}